

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

KINT32 __thiscall
KDIS::NETWORK::Connection::Receive
          (Connection *this,KOCTET *Buffer,KUINT32 BufferSz,KString *SenderIp)

{
  uint __i;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  KException *pKVar4;
  int *piVar5;
  KCHAR8 *pKVar6;
  Connection *pCVar7;
  allocator<char> local_f9;
  timeval local_f8;
  socklen_t iSz;
  KString local_d8;
  sockaddr_in ClientAddr;
  fd_set fd;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fd.fds_bits[lVar2] = 0;
  }
  iVar1 = this->m_iSocket[1];
  fd.fds_bits[iVar1 / 0x40] = fd.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
  if (this->m_bBlockingSocket == false) {
    local_f8.tv_sec = 0;
    local_f8.tv_usec = 1;
  }
  else {
    local_f8.tv_sec = (this->m_blockingTimeout).tv_sec;
    local_f8.tv_usec = (this->m_blockingTimeout).tv_usec;
  }
  iVar1 = select(iVar1 + 1,(fd_set *)&fd,(fd_set *)0x0,(fd_set *)0x0,&local_f8);
  if (iVar1 != 0) {
    if (iVar1 == -1) {
      pCVar7 = (Connection *)0x30;
      pKVar4 = (KException *)__cxa_allocate_exception();
      piVar5 = __errno_location();
      pKVar6 = getErrorText(pCVar7,*piVar5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,pKVar6,(allocator<char> *)&ClientAddr);
      KException::KException(pKVar4,&local_d8,0xc);
      __cxa_throw(pKVar4,&KException::typeinfo,KException::~KException);
    }
    iSz = 0x10;
    sVar3 = recvfrom(this->m_iSocket[1],Buffer,(ulong)BufferSz,0,(sockaddr *)&ClientAddr,&iSz);
    iVar1 = (int)sVar3;
    if (iVar1 == -1) {
      pCVar7 = (Connection *)0x30;
      pKVar4 = (KException *)__cxa_allocate_exception();
      piVar5 = __errno_location();
      pKVar6 = getErrorText(pCVar7,*piVar5);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pKVar6,&local_f9);
      KException::KException(pKVar4,&local_d8,0xc);
      __cxa_throw(pKVar4,&KException::typeinfo,KException::~KException);
    }
    if (SenderIp != (KString *)0x0) {
      inet_ntoa((in_addr)ClientAddr.sin_addr.s_addr);
      std::__cxx11::string::assign((char *)SenderIp);
    }
  }
  return iVar1;
}

Assistant:

KINT32 Connection::Receive(KOCTET *Buffer, KUINT32 BufferSz, KString *SenderIp /*= NULL*/ ) noexcept(false)
{
    // We use fd_set to test the receive socket for readability. This is used in both blocking
    // and none blocking mode however it is primarily here for none blocking mode as it is more
    // efficient to use this method than to continuously poll the socket.
    fd_set fd;
    FD_ZERO( &fd );
    FD_SET( m_iSocket[RECEIVE_SOCK], &fd );
    timeval pTimeout;

    if( !m_bBlockingSocket )
    {
        // If we are using none blocking mode we need to set
        // a time limit to wait for the select function.
        timeval tval;
        tval.tv_sec  = 0;
        tval.tv_usec = 1;
        pTimeout = tval;
    }
    else
    {
        // Even in blocking mode, it can be useful to return
        // occasionally after a long period without data.
        // where (long period == a second or so).
        // This can make clean exits a joy and allow status messages
        // from the same thread
        pTimeout = m_blockingTimeout;
    }

    // Check the socket, do we have data waiting?
    KINT32 uiErr = select( m_iSocket[RECEIVE_SOCK] + 1, &fd, 0, 0, &pTimeout );

    if( uiErr == SOCKET_ERROR )
    {
        THROW_ERROR;
    }

    if( uiErr ) // If none zero we have data waiting
    {
        // Get data from socket
        sockaddr_in ClientAddr;
        socklen_t iSz = sizeof( ClientAddr );
        uiErr = recvfrom( m_iSocket[RECEIVE_SOCK], Buffer, BufferSz, 0, ( sockaddr * )&ClientAddr, &iSz );

        if( uiErr == SOCKET_ERROR )
        {
            THROW_ERROR;
        }

        // Do we need the sending IP address?
        if( SenderIp )
        {
            *SenderIp = inet_ntoa( ClientAddr.sin_addr );
        }
    }

    return uiErr;
}